

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

void __thiscall kj::anon_unknown_123::AsyncPipe::BlockedPumpTo::shutdownWrite(BlockedPumpTo *this)

{
  PromiseFulfiller<unsigned_long> *pPVar1;
  unsigned_long local_28;
  ArrayPtr<const_char> local_20;
  BlockedPumpTo *local_10;
  BlockedPumpTo *this_local;
  
  local_10 = this;
  StringPtr::StringPtr((StringPtr *)&local_20,"shutdownWrite() was called");
  Canceler::cancel(&this->canceler,(StringPtr)local_20);
  pPVar1 = this->fulfiller;
  local_28 = cp<unsigned_long>(&this->pumpedSoFar);
  (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_28);
  endState(this->pipe,(AsyncIoStream *)this);
  AsyncPipe::shutdownWrite(this->pipe);
  return;
}

Assistant:

void shutdownWrite() override {
      canceler.cancel("shutdownWrite() was called");
      fulfiller.fulfill(kj::cp(pumpedSoFar));
      pipe.endState(*this);
      pipe.shutdownWrite();
    }